

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O1

void __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)1>::~basic_random_coro_file
          (basic_random_coro_file<(coro_io::execution_type)1> *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->file_path_)._M_dataplus._M_p;
  paVar2 = &(this->file_path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  this_00 = (this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->executor_wrapper_).super_Executor._vptr_Executor = (_func_int **)&PTR__Executor_00165d88;
  pcVar1 = (this->executor_wrapper_).super_Executor._name._M_dataplus._M_p;
  paVar2 = &(this->executor_wrapper_).super_Executor._name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

basic_random_coro_file(coro_io::ExecutorWrapper<> *executor =
                             coro_io::get_global_block_executor())
      : basic_random_coro_file(executor->get_asio_executor()) {}